

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool __thiscall
sf::VertexBuffer::update(VertexBuffer *this,Vertex *vertices,size_t vertexCount,uint offset)

{
  PFNGLBUFFERDATAARBPROC p_Var1;
  GLenum GVar2;
  uint in_ECX;
  ulong in_RDX;
  void *in_RSI;
  TransientContextLock *in_RDI;
  TransientContextLock contextLock;
  TransientContextLock *in_stack_ffffffffffffffb0;
  bool local_1;
  
  if (*(int *)(in_RDI + 8) == 0) {
    local_1 = false;
  }
  else if (in_RSI == (void *)0x0) {
    local_1 = false;
  }
  else if ((in_ECX == 0) || (in_ECX + in_RDX <= *(ulong *)(in_RDI + 0x10))) {
    GlResource::TransientContextLock::TransientContextLock(in_RDI);
    (*sf_glad_glBindBufferARB)(0x8892,*(GLuint *)(in_RDI + 8));
    p_Var1 = sf_glad_glBufferDataARB;
    if (*(ulong *)(in_RDI + 0x10) <= in_RDX) {
      in_stack_ffffffffffffffb0 = (TransientContextLock *)(in_RDX * 0x14);
      GVar2 = anon_unknown.dwarf_12082e::VertexBufferImpl::usageToGlEnum(*(Usage *)(in_RDI + 0x1c));
      (*p_Var1)(0x8892,(GLsizeiptrARB)in_stack_ffffffffffffffb0,(void *)0x0,GVar2);
      *(ulong *)(in_RDI + 0x10) = in_RDX;
    }
    (*sf_glad_glBufferSubDataARB)(0x8892,(ulong)in_ECX * 0x14,in_RDX * 0x14,in_RSI);
    (*sf_glad_glBindBufferARB)(0x8892,0);
    local_1 = true;
    GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffffb0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VertexBuffer::update(const Vertex* vertices, std::size_t vertexCount, unsigned int offset)
{
    // Sanity checks
    if (!m_buffer)
        return false;

    if (!vertices)
        return false;

    if (offset && (offset + vertexCount > m_size))
        return false;

    TransientContextLock contextLock;

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    // Check if we need to resize or orphan the buffer
    if (vertexCount >= m_size)
    {
        glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexCount), 0, VertexBufferImpl::usageToGlEnum(m_usage)));

        m_size = vertexCount;
    }

    glCheck(GLEXT_glBufferSubData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLintptrARB>(sizeof(Vertex) * offset), static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexCount), vertices));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    return true;
}